

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.h
# Opt level: O0

int __thiscall
icu_63::LocaleCacheKey<icu_63::SharedCalendar>::clone
          (LocaleCacheKey<icu_63::SharedCalendar> *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  LocaleCacheKey<icu_63::SharedCalendar> *this_00;
  undefined8 local_30;
  LocaleCacheKey<icu_63::SharedCalendar> *this_local;
  
  this_00 = (LocaleCacheKey<icu_63::SharedCalendar> *)
            UMemory::operator_new((UMemory *)0xf0,(size_t)__fn);
  local_30 = (LocaleCacheKey<icu_63::SharedCalendar> *)0x0;
  if (this_00 != (LocaleCacheKey<icu_63::SharedCalendar> *)0x0) {
    LocaleCacheKey(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

virtual CacheKeyBase *clone() const {
       return new LocaleCacheKey<T>(*this);
   }